

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

TCGv_i64 do_last_scalar(DisasContext_conflict1 *s,int esz,int pg,int rm,_Bool before)

{
  uint arg2;
  uint uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 v1;
  TCGv_i32 c2;
  TCGv_i64 pTVar2;
  uintptr_t o;
  undefined7 in_register_00000081;
  uintptr_t o_2;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  find_last_active(s,ret,esz,pg);
  if ((int)CONCAT71(in_register_00000081,before) == 0) {
    incr_last_active(s,ret,esz);
  }
  else {
    tcg_ctx_00 = s->uc->tcg_ctx;
    uVar1 = s->sve_len;
    arg2 = uVar1 - 1;
    if (arg2 < (uVar1 ^ arg2)) {
      tcg_gen_andi_i32_aarch64(tcg_ctx_00,ret,ret,arg2);
    }
    else {
      v1 = tcg_const_i32_aarch64(tcg_ctx_00,uVar1 + (-1 << ((byte)esz & 0x1f)));
      c2 = tcg_const_i32_aarch64(tcg_ctx_00,0);
      tcg_gen_movcond_i32_aarch64(tcg_ctx_00,TCG_COND_LT,ret,ret,c2,v1,ret);
      tcg_temp_free_internal_aarch64(tcg_ctx_00,(TCGTemp *)(v1 + (long)tcg_ctx_00));
      tcg_temp_free_internal_aarch64(tcg_ctx_00,(TCGTemp *)(c2 + (long)tcg_ctx_00));
    }
  }
  pTVar2 = load_last_active(s,ret,rm,esz);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return pTVar2;
}

Assistant:

static TCGv_i64 do_last_scalar(DisasContext *s, int esz,
                               int pg, int rm, bool before)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 last = tcg_temp_new_i32(tcg_ctx);
    TCGv_i64 ret;

    find_last_active(s, last, esz, pg);
    if (before) {
        wrap_last_active(s, last, esz);
    } else {
        incr_last_active(s, last, esz);
    }

    ret = load_last_active(s, last, rm, esz);
    tcg_temp_free_i32(tcg_ctx, last);
    return ret;
}